

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  MethodGroup *pMVar1;
  FirstGroup *this_00;
  MethodGroup *extraout_RAX;
  IndexGroup *this_01;
  MethodGroup *extraout_RAX_00;
  AttributeGroup *this_02;
  char *name_00;
  char *descr;
  Primitive primitive_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  bool bVar2;
  bool bVar3;
  undefined1 local_88 [8];
  string desc;
  string name;
  int ndx;
  Primitive primitive [7];
  bool hasFirst;
  bool indexed;
  MethodGroup *this_local;
  
  bVar2 = true;
  if ((this->m_method != DRAWMETHOD_DRAWELEMENTS) &&
     (bVar2 = true, this->m_method != DRAWMETHOD_DRAWELEMENTS_INSTANCED)) {
    bVar2 = this->m_method == DRAWMETHOD_DRAWELEMENTS_RANGED;
  }
  bVar3 = true;
  if (this->m_method != DRAWMETHOD_DRAWARRAYS) {
    bVar3 = this->m_method == DRAWMETHOD_DRAWARRAYS_INSTANCED;
  }
  primitive[0] = PRIMITIVE_TRIANGLE_FAN;
  primitive[1] = PRIMITIVE_TRIANGLE_STRIP;
  primitive[2] = PRIMITIVE_LINES;
  primitive[3] = PRIMITIVE_LINE_STRIP;
  pMVar1 = (MethodGroup *)0x6;
  primitive[4] = PRIMITIVE_LINE_LOOP;
  if (bVar3) {
    this_00 = (FirstGroup *)operator_new(0x80);
    FirstGroup::FirstGroup
              (this_00,(this->super_TestCaseGroup).m_context,"first","First tests",this->m_method);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    pMVar1 = extraout_RAX;
    in_RDX = extraout_RDX;
  }
  if ((bVar2) && (pMVar1 = this, this->m_method != DRAWMETHOD_DRAWELEMENTS_RANGED)) {
    this_01 = (IndexGroup *)operator_new(0x80);
    IndexGroup::IndexGroup
              (this_01,(this->super_TestCaseGroup).m_context,"indices","Index tests",this->m_method)
    ;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    pMVar1 = extraout_RAX_00;
    in_RDX = extraout_RDX_00;
  }
  name.field_2._8_4_ = 0;
  while ((int)name.field_2._8_4_ < 7) {
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)primitive[(long)(int)name.field_2._8_4_ + -2],
               (Primitive)in_RDX);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              ((string *)local_88,
               (DrawTestSpec *)(ulong)primitive[(long)(int)name.field_2._8_4_ + -2],primitive_00);
    this_02 = (AttributeGroup *)operator_new(0x88);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    AttributeGroup::AttributeGroup
              (this_02,context,name_00,descr,this->m_method,
               primitive[(long)(int)name.field_2._8_4_ + -2],INDEXTYPE_SHORT,STORAGE_BUFFER);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    name.field_2._8_4_ = name.field_2._8_4_ + 1;
    pMVar1 = (MethodGroup *)(ulong)(uint)name.field_2._8_4_;
    in_RDX = extraout_RDX_01;
  }
  return (int)pMVar1;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED);
	const bool hasFirst		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (hasFirst)
	{
		// First-tests
		this->addChild(new FirstGroup(m_context, "first", "First tests", m_method));
	}

	if (indexed)
	{
		// Index-tests
		if (m_method != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
			this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}